

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O2

void Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
               (basic_ostream<char,_std::char_traits<char>_> *out,float v)

{
  uchar b [4];
  
  std::ostream::write((char *)out,(long)b);
  return;
}

Assistant:

void
write (T& out, float v)
{
    union
    {
        unsigned int i;
        float        f;
    } u;
    u.f = v;

    unsigned char b[4];

    b[0] = (unsigned char) (u.i);
    b[1] = (unsigned char) (u.i >> 8);
    b[2] = (unsigned char) (u.i >> 16);
    b[3] = (unsigned char) (u.i >> 24);

    writeUnsignedChars<S> (out, b, 4);
}